

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

UBool isCnvAcceptable(void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  if (((((0x13 < pInfo->size) && (pInfo->isBigEndian == '\0')) && (pInfo->charsetFamily == '\0')) &&
      ((pInfo->sizeofUChar == '\x02' && (pInfo->dataFormat[0] == 'c')))) &&
     ((pInfo->dataFormat[1] == 'n' &&
      ((pInfo->dataFormat[2] == 'v' && (pInfo->dataFormat[3] == 't')))))) {
    return pInfo->formatVersion[0] == '\x06';
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
isCnvAcceptable(void * /*context*/,
                const char * /*type*/, const char * /*name*/,
                const UDataInfo *pInfo) {
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->sizeofUChar==U_SIZEOF_UCHAR &&
        pInfo->dataFormat[0]==0x63 &&   /* dataFormat="cnvt" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x74 &&
        pInfo->formatVersion[0]==6);  /* Everything will be version 6 */
}